

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_interface.cc
# Opt level: O0

int sentencepiece::PieceToByte(string_view piece)

{
  bool bVar1;
  int iVar2;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_true>
  this;
  pointer pvVar3;
  const_iterator it;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
  *in_stack_ffffffffffffff78;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_true>
  local_68;
  allocator<char> local_59;
  string local_58 [8];
  allocator<char> *in_stack_ffffffffffffffb0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_true>
  local_38 [3];
  anon_class_1_0_00000001 *in_stack_ffffffffffffffe0;
  uint local_4;
  
  if (PieceToByte(std::basic_string_view<char,std::char_traits<char>>)::kMap_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&PieceToByte(std::basic_string_view<char,std::char_traits<char>>)::
                                 kMap_abi_cxx11_);
    if (iVar2 != 0) {
      PieceToByte(std::basic_string_view<char,std::char_traits<char>>)::kMap_abi_cxx11_ =
           PieceToByte(std::basic_string_view<char,std::char_traits<char>>)::$_0::
           operator()[abi_cxx11_(in_stack_ffffffffffffffe0);
      __cxa_guard_release(&PieceToByte(std::basic_string_view<char,std::char_traits<char>>)::
                           kMap_abi_cxx11_);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  this._M_cur = (__node_type *)
                std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
                ::find(in_stack_ffffffffffffff78,(key_type *)0x46dbf4);
  local_38[0]._M_cur = this._M_cur;
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  local_68._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
       ::end(this._M_cur);
  bVar1 = std::__detail::operator==(local_38,&local_68);
  if (bVar1) {
    local_4 = 0xffffffff;
  }
  else {
    pvVar3 = std::__detail::
             _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_false,_true>
             ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_false,_true>
                           *)0x46dca4);
    local_4 = (uint)pvVar3->second;
  }
  return local_4;
}

Assistant:

int PieceToByte(absl::string_view piece) {
  using PieceToByteMap = absl::flat_hash_map<std::string, unsigned char>;
  static const auto *const kMap = []() -> PieceToByteMap * {
    auto *m = new PieceToByteMap();
    for (int i = 0; i < 256; ++i) {
      (*m)[ByteToPiece(i)] = i;
    }
    return m;
  }();
  const auto it = kMap->find(std::string(piece));
  if (it == kMap->end()) {
    return -1;
  } else {
    return it->second;
  }
}